

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
kernel::BlockTreeDB::WriteBatchSync
          (BlockTreeDB *this,
          vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
          *fileInfo,int nLastFile,
          vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *blockinfo)

{
  pointer ppVar1;
  pointer ppCVar2;
  CBlockIndex *this_00;
  bool bVar3;
  type *file;
  pointer ppVar4;
  pointer ppCVar5;
  long in_FS_OFFSET;
  CDBBatch batch;
  int nLastFile_local;
  CDiskBlockIndex local_138;
  uint256 local_79;
  pair<unsigned_char,_uint256> local_59;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nLastFile_local = nLastFile;
  CDBBatch::CDBBatch(&batch,&this->super_CDBWrapper);
  ppVar1 = (fileInfo->
           super__Vector_base<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (fileInfo->
                super__Vector_base<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    local_138.super_CBlockIndex.phashBlock = (uint256 *)((ulong)(uint)ppVar4->first << 0x20 | 0x66);
    CDBBatch::Write<std::pair<unsigned_char,int>,CBlockFileInfo>
              (&batch,(pair<unsigned_char,_int> *)&local_138,ppVar4->second);
  }
  CDBBatch::Write<unsigned_char,int>(&batch,"lF\x01",&nLastFile_local);
  ppCVar2 = (blockinfo->
            super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar5 = (blockinfo->
                 super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppCVar5 != ppCVar2; ppCVar5 = ppCVar5 + 1
      ) {
    this_00 = *ppCVar5;
    CBlockIndex::GetBlockHash(&local_79,this_00);
    local_59.first = 'b';
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x10];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x11];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x12];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x13];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x14];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x15];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x16];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x17];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x18];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x19];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x1a];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x1b];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x1c];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x1d];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x1e];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_79.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0] =
         local_79.super_base_blob<256U>.m_data._M_elems[0];
    local_59.second.super_base_blob<256U>.m_data._M_elems[1] =
         local_79.super_base_blob<256U>.m_data._M_elems[1];
    local_59.second.super_base_blob<256U>.m_data._M_elems[2] =
         local_79.super_base_blob<256U>.m_data._M_elems[2];
    local_59.second.super_base_blob<256U>.m_data._M_elems[3] =
         local_79.super_base_blob<256U>.m_data._M_elems[3];
    local_59.second.super_base_blob<256U>.m_data._M_elems[4] =
         local_79.super_base_blob<256U>.m_data._M_elems[4];
    local_59.second.super_base_blob<256U>.m_data._M_elems[5] =
         local_79.super_base_blob<256U>.m_data._M_elems[5];
    local_59.second.super_base_blob<256U>.m_data._M_elems[6] =
         local_79.super_base_blob<256U>.m_data._M_elems[6];
    local_59.second.super_base_blob<256U>.m_data._M_elems[7] =
         local_79.super_base_blob<256U>.m_data._M_elems[7];
    local_59.second.super_base_blob<256U>.m_data._M_elems[8] =
         local_79.super_base_blob<256U>.m_data._M_elems[8];
    local_59.second.super_base_blob<256U>.m_data._M_elems[9] =
         local_79.super_base_blob<256U>.m_data._M_elems[9];
    local_59.second.super_base_blob<256U>.m_data._M_elems[10] =
         local_79.super_base_blob<256U>.m_data._M_elems[10];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_79.super_base_blob<256U>.m_data._M_elems[0xb];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_79.super_base_blob<256U>.m_data._M_elems[0xc];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_79.super_base_blob<256U>.m_data._M_elems[0xd];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_79.super_base_blob<256U>.m_data._M_elems[0xe];
    local_59.second.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_79.super_base_blob<256U>.m_data._M_elems[0xf];
    CDiskBlockIndex::CDiskBlockIndex(&local_138,this_00);
    CDBBatch::Write<std::pair<unsigned_char,uint256>,CDiskBlockIndex>(&batch,&local_59,&local_138);
  }
  bVar3 = CDBWrapper::WriteBatch(&this->super_CDBWrapper,&batch,true);
  CDBBatch::~CDBBatch(&batch);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockTreeDB::WriteBatchSync(const std::vector<std::pair<int, const CBlockFileInfo*>>& fileInfo, int nLastFile, const std::vector<const CBlockIndex*>& blockinfo)
{
    CDBBatch batch(*this);
    for (const auto& [file, info] : fileInfo) {
        batch.Write(std::make_pair(DB_BLOCK_FILES, file), *info);
    }
    batch.Write(DB_LAST_BLOCK, nLastFile);
    for (const CBlockIndex* bi : blockinfo) {
        batch.Write(std::make_pair(DB_BLOCK_INDEX, bi->GetBlockHash()), CDiskBlockIndex{bi});
    }
    return WriteBatch(batch, true);
}